

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

void __thiscall testing::internal::Mutex::Mutex(Mutex *this)

{
  int iVar1;
  ostream *poVar2;
  GTestLog local_14;
  
  iVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  if (iVar1 != 0) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x6af);
    poVar2 = std::operator<<((ostream *)&std::cerr,"pthread_mutex_init(&mutex_, nullptr)");
    poVar2 = std::operator<<(poVar2,"failed with error ");
    std::ostream::operator<<(poVar2,iVar1);
    GTestLog::~GTestLog(&local_14);
  }
  (this->super_MutexBase).has_owner_ = false;
  return;
}

Assistant:

Mutex() {
    GTEST_CHECK_POSIX_SUCCESS_(pthread_mutex_init(&mutex_, nullptr));
    has_owner_ = false;
  }